

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z1_4xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  uint in_R8D;
  uint in_R9D;
  int i_1;
  __m128i dstvec [16];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_854;
  undefined8 local_850 [38];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  int local_658;
  uint local_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  int local_568;
  int local_564;
  byte local_55c;
  undefined8 *local_550;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  ushort local_4a8;
  ushort local_4a6;
  undefined2 local_4a4;
  undefined2 local_4a2;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  uint8_t local_460 [8];
  uint8_t auStack_458 [8];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined1 auStack_430 [16];
  undefined2 local_420;
  undefined2 local_41e;
  undefined2 local_41c;
  undefined2 local_41a;
  undefined2 local_418;
  undefined2 local_416;
  undefined2 local_414;
  undefined2 local_412;
  undefined2 local_410;
  undefined2 local_40e;
  undefined2 local_40c;
  undefined2 local_40a;
  undefined2 local_408;
  undefined2 local_406;
  undefined2 local_404;
  undefined2 local_402;
  undefined1 local_400 [32];
  undefined2 local_3e0;
  undefined2 local_3de;
  undefined2 local_3dc;
  undefined2 local_3da;
  undefined2 local_3d8;
  undefined2 local_3d6;
  undefined2 local_3d4;
  undefined2 local_3d2;
  undefined2 local_3d0;
  undefined2 local_3ce;
  undefined2 local_3cc;
  undefined2 local_3ca;
  undefined2 local_3c8;
  undefined2 local_3c6;
  undefined2 local_3c4;
  undefined2 local_3c2;
  undefined1 local_3c0 [32];
  ushort local_3a0;
  ushort local_39e;
  ushort local_39c;
  ushort local_39a;
  ushort local_398;
  ushort local_396;
  ushort local_394;
  ushort local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [32];
  ushort local_360;
  ushort local_35e;
  ushort local_35c;
  ushort local_35a;
  ushort local_358;
  ushort local_356;
  ushort local_354;
  ushort local_352;
  ushort local_350;
  ushort local_34e;
  ushort local_34c;
  ushort local_34a;
  ushort local_348;
  ushort local_346;
  ushort local_344;
  ushort local_342;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 auStack_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [32];
  undefined1 (*local_238) [16];
  undefined1 (*local_230) [16];
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 local_1e4;
  undefined1 local_1e0 [32];
  undefined4 local_1a4;
  undefined1 local_1a0 [32];
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  byte local_71;
  undefined1 local_70 [16];
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_544 = 4;
  local_550 = local_850;
  local_564 = 6 - in_R8D;
  local_55c = (byte)in_R8D;
  local_568 = in_EDI + 3 << (local_55c & 0x1f);
  local_4a2 = 0x10;
  local_402 = 0x10;
  local_404 = 0x10;
  local_406 = 0x10;
  local_408 = 0x10;
  local_40a = 0x10;
  local_40c = 0x10;
  local_40e = 0x10;
  local_410 = 0x10;
  local_412 = 0x10;
  local_414 = 0x10;
  local_416 = 0x10;
  local_418 = 0x10;
  local_41a = 0x10;
  local_41c = 0x10;
  local_41e = 0x10;
  local_420 = 0x10;
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  local_440 = vpinsrw_avx(auVar1,0x10,7);
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auStack_430 = vpinsrw_avx(auVar1,0x10,7);
  local_600 = local_440._0_8_;
  uStack_5f8 = local_440._8_8_;
  uStack_5f0 = auStack_430._0_8_;
  uStack_5e8 = auStack_430._8_8_;
  local_71 = *(byte *)(in_RCX + local_568);
  local_51 = local_71;
  local_52 = local_71;
  local_53 = local_71;
  local_54 = local_71;
  local_55 = local_71;
  local_56 = local_71;
  local_57 = local_71;
  local_58 = local_71;
  local_59 = local_71;
  local_5a = local_71;
  local_5b = local_71;
  local_5c = local_71;
  local_5d = local_71;
  local_5e = local_71;
  local_5f = local_71;
  local_60 = local_71;
  auVar1 = vpinsrb_avx(ZEXT116(local_71),(uint)local_71,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_71,0xe);
  local_70 = vpinsrb_avx(auVar1,(uint)local_71,0xf);
  local_650 = local_70._0_8_;
  uStack_648 = local_70._8_8_;
  local_4a4 = 0x3f;
  local_3c2 = 0x3f;
  local_3c4 = 0x3f;
  local_3c6 = 0x3f;
  local_3c8 = 0x3f;
  local_3ca = 0x3f;
  local_3cc = 0x3f;
  local_3ce = 0x3f;
  local_3d0 = 0x3f;
  local_3d2 = 0x3f;
  local_3d4 = 0x3f;
  local_3d6 = 0x3f;
  local_3d8 = 0x3f;
  local_3da = 0x3f;
  local_3dc = 0x3f;
  local_3de = 0x3f;
  local_3e0 = 0x3f;
  auVar1 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar1 = vpinsrw_avx(auVar1,0x3f,2);
  auVar1 = vpinsrw_avx(auVar1,0x3f,3);
  auVar1 = vpinsrw_avx(auVar1,0x3f,4);
  auVar1 = vpinsrw_avx(auVar1,0x3f,5);
  auVar1 = vpinsrw_avx(auVar1,0x3f,6);
  auVar1 = vpinsrw_avx(auVar1,0x3f,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar2 = vpinsrw_avx(auVar2,0x3f,2);
  auVar2 = vpinsrw_avx(auVar2,0x3f,3);
  auVar2 = vpinsrw_avx(auVar2,0x3f,4);
  auVar2 = vpinsrw_avx(auVar2,0x3f,5);
  auVar2 = vpinsrw_avx(auVar2,0x3f,6);
  auVar2 = vpinsrw_avx(auVar2,0x3f,7);
  local_400._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_400._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_640 = local_400._0_16_;
  auStack_630 = local_400._16_16_;
  local_658 = 0;
  local_654 = in_R9D;
  while( true ) {
    if (in_EDI <= local_658) goto LAB_005aa280;
    local_6f4 = (int)local_654 >> ((byte)(6 - in_R8D) & 0x1f);
    local_6f8 = local_568 - local_6f4 >> (local_55c & 0x1f);
    if (local_6f8 < 1) break;
    if (4 < local_6f8) {
      local_6f8 = 4;
    }
    local_230 = (undefined1 (*) [16])(in_RCX + local_6f4);
    local_6e0 = *local_230;
    local_238 = (undefined1 (*) [16])(in_RCX + local_6f4 + 1);
    local_6f0 = *local_238;
    if (in_R8D == 0) {
      local_4a8 = (ushort)local_654;
      local_342 = (ushort)local_654;
      local_344 = (ushort)local_654;
      local_346 = (ushort)local_654;
      local_348 = (ushort)local_654;
      local_34a = (ushort)local_654;
      local_34c = (ushort)local_654;
      local_34e = (ushort)local_654;
      local_350 = (ushort)local_654;
      local_352 = (ushort)local_654;
      local_354 = (ushort)local_654;
      local_356 = (ushort)local_654;
      local_358 = (ushort)local_654;
      local_35a = (ushort)local_654;
      local_35c = (ushort)local_654;
      local_35e = (ushort)local_654;
      local_360 = (ushort)local_654;
      auVar1 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,2);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,3);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,4);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,5);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,6);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,7);
      auVar2 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,2);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,3);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,4);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,5);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,6);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,7);
      local_380._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      local_380._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_2a0 = local_380._0_16_;
      auStack_290 = local_380._16_16_;
      local_2c0 = local_400._0_16_;
      auStack_2b0 = local_400._16_16_;
      auVar6._16_8_ = local_380._16_8_;
      auVar6._0_16_ = local_380._0_16_;
      auVar6._24_8_ = local_380._24_8_;
      auVar3._16_8_ = local_400._16_8_;
      auVar3._0_16_ = local_400._0_16_;
      auVar3._24_8_ = local_400._24_8_;
      local_1e0 = vpand_avx2(auVar6,auVar3);
      local_1e4 = 1;
      local_6c0 = vpsrlw_avx2(local_1e0,ZEXT416(1));
    }
    else {
      local_450 = *(undefined8 *)*local_230;
      uStack_448 = *(undefined8 *)(*local_230 + 8);
      local_460[0] = EvenOddMaskx[0][0];
      local_460[1] = EvenOddMaskx[0][1];
      local_460[2] = EvenOddMaskx[0][2];
      local_460[3] = EvenOddMaskx[0][3];
      local_460[4] = EvenOddMaskx[0][4];
      local_460[5] = EvenOddMaskx[0][5];
      local_460[6] = EvenOddMaskx[0][6];
      local_460[7] = EvenOddMaskx[0][7];
      auStack_458[0] = EvenOddMaskx[0][8];
      auStack_458[1] = EvenOddMaskx[0][9];
      auStack_458[2] = EvenOddMaskx[0][10];
      auStack_458[3] = EvenOddMaskx[0][0xb];
      auStack_458[4] = EvenOddMaskx[0][0xc];
      auStack_458[5] = EvenOddMaskx[0][0xd];
      auStack_458[6] = EvenOddMaskx[0][0xe];
      auStack_458[7] = EvenOddMaskx[0][0xf];
      auVar1[8] = EvenOddMaskx[0][8];
      auVar1[9] = EvenOddMaskx[0][9];
      auVar1[10] = EvenOddMaskx[0][10];
      auVar1[0xb] = EvenOddMaskx[0][0xb];
      auVar1[0xc] = EvenOddMaskx[0][0xc];
      auVar1[0xd] = EvenOddMaskx[0][0xd];
      auVar1[0xe] = EvenOddMaskx[0][0xe];
      auVar1[0xf] = EvenOddMaskx[0][0xf];
      auVar1[0] = EvenOddMaskx[0][0];
      auVar1[1] = EvenOddMaskx[0][1];
      auVar1[2] = EvenOddMaskx[0][2];
      auVar1[3] = EvenOddMaskx[0][3];
      auVar1[4] = EvenOddMaskx[0][4];
      auVar1[5] = EvenOddMaskx[0][5];
      auVar1[6] = EvenOddMaskx[0][6];
      auVar1[7] = EvenOddMaskx[0][7];
      local_6e0 = vpshufb_avx(*local_230,auVar1);
      local_6f0 = vpsrldq_avx(local_6e0,8);
      local_4a6 = (ushort)local_654;
      local_382 = (ushort)local_654;
      local_384 = (ushort)local_654;
      local_386 = (ushort)local_654;
      local_388 = (ushort)local_654;
      local_38a = (ushort)local_654;
      local_38c = (ushort)local_654;
      local_38e = (ushort)local_654;
      local_390 = (ushort)local_654;
      local_392 = (ushort)local_654;
      local_394 = (ushort)local_654;
      local_396 = (ushort)local_654;
      local_398 = (ushort)local_654;
      local_39a = (ushort)local_654;
      local_39c = (ushort)local_654;
      local_39e = (ushort)local_654;
      local_3a0 = (ushort)local_654;
      auVar1 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,2);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,3);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,4);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,5);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,6);
      auVar1 = vpinsrw_avx(auVar1,local_654 & 0xffff,7);
      auVar2 = vpinsrw_avx(ZEXT216((ushort)local_654),local_654 & 0xffff,1);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,2);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,3);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,4);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,5);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,6);
      auVar2 = vpinsrw_avx(auVar2,local_654 & 0xffff,7);
      local_3c0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      local_3c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_120 = local_3c0._0_16_;
      auStack_110 = local_3c0._16_16_;
      auVar8._16_8_ = local_3c0._16_8_;
      auVar8._0_16_ = local_3c0._0_16_;
      auVar8._24_8_ = local_3c0._24_8_;
      local_260 = vpsllw_avx2(auVar8,ZEXT416(in_R8D));
      local_280 = local_400._0_16_;
      auStack_270 = local_400._16_16_;
      auVar7._16_8_ = local_400._16_8_;
      auVar7._0_16_ = local_400._0_16_;
      auVar7._24_8_ = local_400._24_8_;
      local_1a0 = vpand_avx2(local_260,auVar7);
      local_1a4 = 1;
      local_6c0 = vpsrlw_avx2(local_1a0,ZEXT416(1));
    }
    local_40 = local_6e0._0_8_;
    uStack_38 = local_6e0._8_8_;
    local_5a0 = vpmovzxbw_avx2(local_6e0);
    local_50 = local_6f0._0_8_;
    uStack_48 = local_6f0._8_8_;
    local_5c0 = vpmovzxbw_avx2(local_6f0);
    local_2e0 = local_5c0._0_8_;
    uStack_2d8 = local_5c0._8_8_;
    uStack_2d0 = local_5c0._16_8_;
    uStack_2c8 = local_5c0._24_8_;
    local_300 = local_5a0._0_8_;
    uStack_2f8 = local_5a0._8_8_;
    uStack_2f0 = local_5a0._16_8_;
    uStack_2e8 = local_5a0._24_8_;
    local_620 = vpsubw_avx2(local_5c0,local_5a0);
    local_160 = local_5a0._0_8_;
    uStack_158 = local_5a0._8_8_;
    uStack_150 = local_5a0._16_8_;
    uStack_148 = local_5a0._24_8_;
    local_164 = 5;
    auVar3 = vpsllw_avx2(local_5a0,ZEXT416(5));
    local_5e0._0_8_ = auVar3._0_8_;
    local_5e0._8_8_ = auVar3._8_8_;
    local_5e0._16_8_ = auVar3._16_8_;
    local_5e0._24_8_ = auVar3._24_8_;
    local_4e0 = local_5e0._0_8_;
    uStack_4d8 = local_5e0._8_8_;
    uStack_4d0 = local_5e0._16_8_;
    uStack_4c8 = local_5e0._24_8_;
    local_500 = local_440._0_8_;
    uStack_4f8 = local_440._8_8_;
    uStack_4f0 = auStack_430._0_8_;
    uStack_4e8 = auStack_430._8_8_;
    auVar4._16_8_ = auStack_430._0_8_;
    auVar4._0_16_ = local_440;
    auVar4._24_8_ = auStack_430._8_8_;
    local_5e0 = vpaddw_avx2(auVar3,auVar4);
    local_e0 = local_620._0_8_;
    uStack_d8 = local_620._8_8_;
    uStack_d0 = local_620._16_8_;
    uStack_c8 = local_620._24_8_;
    local_100 = local_6c0._0_8_;
    uStack_f8 = local_6c0._8_8_;
    uStack_f0 = local_6c0._16_8_;
    uStack_e8 = local_6c0._24_8_;
    local_680 = vpmullw_avx2(local_620,local_6c0);
    local_520 = local_5e0._0_8_;
    uStack_518 = local_5e0._8_8_;
    uStack_510 = local_5e0._16_8_;
    uStack_508 = local_5e0._24_8_;
    local_540 = local_680._0_8_;
    uStack_538 = local_680._8_8_;
    uStack_530 = local_680._16_8_;
    uStack_528 = local_680._24_8_;
    auVar3 = vpaddw_avx2(local_5e0,local_680);
    local_6a0._0_8_ = auVar3._0_8_;
    local_6a0._8_8_ = auVar3._8_8_;
    local_6a0._16_8_ = auVar3._16_8_;
    local_6a0._24_8_ = auVar3._24_8_;
    local_220 = local_6a0._0_8_;
    uStack_218 = local_6a0._8_8_;
    uStack_210 = local_6a0._16_8_;
    uStack_208 = local_6a0._24_8_;
    local_224 = 5;
    auStack_330 = ZEXT416(5);
    auVar3 = vpsrlw_avx2(auVar3,auStack_330);
    local_6a0._0_8_ = auVar3._0_8_;
    local_6a0._8_8_ = auVar3._8_8_;
    local_6a0._16_8_ = auVar3._16_8_;
    local_6a0._24_8_ = auVar3._24_8_;
    local_470 = local_6a0._16_8_;
    uStack_468 = local_6a0._24_8_;
    local_320 = local_6a0._0_8_;
    uStack_318 = local_6a0._8_8_;
    uStack_310 = local_6a0._16_8_;
    uStack_308 = local_6a0._24_8_;
    local_340 = local_6a0._16_8_;
    uStack_338 = local_6a0._24_8_;
    auVar5._16_16_ = auStack_330;
    auVar5._0_16_ = auVar3._16_16_;
    local_6a0 = vpackuswb_avx2(auVar3,auVar5);
    local_4a0 = local_6a0._0_8_;
    uStack_498 = local_6a0._8_8_;
    uStack_490 = local_6a0._16_8_;
    uStack_488 = local_6a0._24_8_;
    local_6d0 = local_6a0._0_8_;
    uStack_6c8 = local_6a0._8_8_;
    local_90 = local_70._0_8_;
    uStack_88 = local_70._8_8_;
    local_a0 = local_6a0._0_8_;
    uStack_98 = local_6a0._8_8_;
    local_b0 = *(undefined8 *)BaseMask[local_6f8];
    uStack_a8 = *(undefined8 *)(BaseMask[local_6f8] + 8);
    auVar1 = vpblendvb_avx(local_70,local_6a0._0_16_,*(undefined1 (*) [16])BaseMask[local_6f8]);
    *(undefined1 (*) [16])(local_850 + (long)local_658 * 2) = auVar1;
    local_654 = in_R9D + local_654;
    local_658 = local_658 + 1;
  }
  for (local_6fc = local_658; local_6fc < in_EDI; local_6fc = local_6fc + 1) {
    local_850[(long)local_6fc * 2] = local_70._0_8_;
    local_850[(long)local_6fc * 2 + 1] = local_70._8_8_;
  }
LAB_005aa280:
  for (local_854 = 0; local_854 < in_EDI; local_854 = local_854 + 1) {
    local_710 = local_850[(long)local_854 * 2];
    uStack_708 = local_850[(long)local_854 * 2 + 1];
    local_720 = local_710;
    uStack_718 = local_850[(long)local_854 * 2 + 1];
    local_720._0_4_ = (undefined4)local_710;
    *(undefined4 *)(in_RSI + in_RDX * local_854) = (undefined4)local_720;
  }
  return;
}

Assistant:

static void dr_prediction_z1_4xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, int upsample_above,
                                      int dx) {
  __m128i dstvec[16];

  dr_prediction_z1_HxW_internal_avx2(4, N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    *(int *)(dst + stride * i) = _mm_cvtsi128_si32(dstvec[i]);
  }
}